

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O2

_Bool cert_expr_valid(char *expression,char **error_msg,ptrlen *error_loc)

{
  ExprNode *en;
  ptrlen expr;
  
  expr = ptrlen_from_asciz(expression);
  en = parse(expr,error_msg,error_loc);
  if (en != (ExprNode *)0x0) {
    exprnode_free(en);
  }
  return en != (ExprNode *)0x0;
}

Assistant:

bool cert_expr_valid(const char *expression,
                     char **error_msg, ptrlen *error_loc)
{
    ExprNode *en = parse(ptrlen_from_asciz(expression), error_msg, error_loc);
    if (en) {
        exprnode_free(en);
        return true;
    } else {
        return false;
    }
}